

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qrhiwidget.cpp
# Opt level: O0

void QRhiWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long lVar1;
  QSize *pQVar2;
  bool bVar3;
  int iVar4;
  TextureFormat TVar5;
  QSize QVar6;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QRhiWidget *_t;
  undefined4 in_stack_ffffffffffffff38;
  TextureFormat in_stack_ffffffffffffff3c;
  QRhiWidget *in_stack_ffffffffffffff40;
  QSize in_stack_ffffffffffffff48;
  QRhiWidget *in_stack_ffffffffffffff50;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff50 = (QRhiWidget *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff50) {
    case (QRhiWidget *)0x0:
      frameSubmitted((QRhiWidget *)0x2c3d81);
      break;
    case (QRhiWidget *)0x1:
      renderFailed((QRhiWidget *)0x2c3d93);
      break;
    case (QRhiWidget *)0x2:
      sampleCountChanged((QRhiWidget *)0x2c3db0,in_stack_ffffffffffffff3c);
      break;
    case (QRhiWidget *)0x3:
      colorBufferFormatChanged((QRhiWidget *)0x2c3dcd,in_stack_ffffffffffffff3c);
      break;
    case (QRhiWidget *)0x4:
      fixedColorBufferSizeChanged
                (in_stack_ffffffffffffff40,
                 (QSize *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      break;
    case (QRhiWidget *)0x5:
      mirrorVerticallyChanged((QRhiWidget *)0x2c3e0a,SUB41(in_stack_ffffffffffffff3c >> 0x18,0));
    }
  }
  if ((in_ESI != 5) ||
     ((((bVar3 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)()>
                           (in_RCX,(void **)frameSubmitted,0,0), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)()>
                           (in_RCX,(void **)renderFailed,0,1), !bVar3)) &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)(int)>
                          (in_RCX,(void **)sampleCountChanged,0,2), !bVar3)) &&
      (((bVar3 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)(QRhiWidget::TextureFormat)>
                           (in_RCX,(void **)colorBufferFormatChanged,0,3), !bVar3 &&
        (bVar3 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)(QSize_const&)>
                           (in_RCX,(void **)fixedColorBufferSizeChanged,0,4), !bVar3)) &&
       (bVar3 = QtMocHelpers::indexOfMethod<void(QRhiWidget::*)(bool)>
                          (in_RCX,(void **)mirrorVerticallyChanged,0,5), !bVar3)))))) {
    if (in_ESI == 1) {
      pQVar2 = *(QSize **)in_RCX;
      in_stack_ffffffffffffff48.ht.m_i = 0;
      in_stack_ffffffffffffff48.wd.m_i = in_EDX;
      switch(in_stack_ffffffffffffff48) {
      case (QSize)0x0:
        iVar4 = sampleCount(in_stack_ffffffffffffff40);
        (pQVar2->wd).m_i = iVar4;
        break;
      case (QSize)0x1:
        TVar5 = colorBufferFormat(in_stack_ffffffffffffff40);
        (pQVar2->wd).m_i = TVar5;
        break;
      case (QSize)0x2:
        QVar6 = fixedColorBufferSize(in_stack_ffffffffffffff40);
        *pQVar2 = QVar6;
        break;
      case (QSize)0x3:
        bVar3 = isMirrorVerticallyEnabled(in_stack_ffffffffffffff40);
        *(bool *)&(pQVar2->wd).m_i = bVar3;
      }
    }
    if (in_ESI == 2) {
      switch((QRhiWidget *)(ulong)in_EDX) {
      case (QRhiWidget *)0x0:
        setSampleCount(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48.ht.m_i.m_i);
        break;
      case (QRhiWidget *)0x1:
        setColorBufferFormat(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48.ht.m_i.m_i);
        break;
      case (QRhiWidget *)0x2:
        setFixedColorBufferSize((QRhiWidget *)(ulong)in_EDX,in_stack_ffffffffffffff48);
        break;
      case (QRhiWidget *)0x3:
        setMirrorVertically(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48.ht.m_i._3_1_);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QRhiWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QRhiWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->frameSubmitted(); break;
        case 1: _t->renderFailed(); break;
        case 2: _t->sampleCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->colorBufferFormatChanged((*reinterpret_cast< std::add_pointer_t<TextureFormat>>(_a[1]))); break;
        case 4: _t->fixedColorBufferSizeChanged((*reinterpret_cast< std::add_pointer_t<QSize>>(_a[1]))); break;
        case 5: _t->mirrorVerticallyChanged((*reinterpret_cast< std::add_pointer_t<bool>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)()>(_a, &QRhiWidget::frameSubmitted, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)()>(_a, &QRhiWidget::renderFailed, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(int )>(_a, &QRhiWidget::sampleCountChanged, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(TextureFormat )>(_a, &QRhiWidget::colorBufferFormatChanged, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(const QSize & )>(_a, &QRhiWidget::fixedColorBufferSizeChanged, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QRhiWidget::*)(bool )>(_a, &QRhiWidget::mirrorVerticallyChanged, 5))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->sampleCount(); break;
        case 1: *reinterpret_cast<TextureFormat*>(_v) = _t->colorBufferFormat(); break;
        case 2: *reinterpret_cast<QSize*>(_v) = _t->fixedColorBufferSize(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->isMirrorVerticallyEnabled(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSampleCount(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setColorBufferFormat(*reinterpret_cast<TextureFormat*>(_v)); break;
        case 2: _t->setFixedColorBufferSize(*reinterpret_cast<QSize*>(_v)); break;
        case 3: _t->setMirrorVertically(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
}